

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O3

var __thiscall cs::runtime_type::parse_fcall(runtime_type *this,var *a,token_base *b)

{
  char *pcVar1;
  token_base *ptVar2;
  _Elt_pointer paVar3;
  int iVar4;
  undefined *puVar5;
  token_base **pptVar6;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *pdVar7;
  callable *pcVar8;
  runtime_error *this_00;
  long in_RCX;
  _Elt_pointer paVar9;
  aligned_type *paVar10;
  _Map_pointer ppaVar11;
  tree_type<cs::token_base_*> *tree;
  slot_type **ppsVar12;
  any *it;
  _Elt_pointer paVar13;
  initializer_list<cs_impl::any> __l;
  var val;
  vector args;
  undefined1 local_98 [8];
  undefined1 local_90 [24];
  string local_78;
  object_method *local_58;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  aligned_type *local_48;
  aligned_type *local_40;
  domain_type *local_38;
  
  if (b->_vptr_token_base == (_func_int **)0x0) {
    puVar5 = &void::typeinfo;
  }
  else {
    puVar5 = (undefined *)(**(code **)(*(long *)b->_vptr_token_base[2] + 0x10))();
  }
  pcVar1 = *(char **)(puVar5 + 8);
  local_40 = (aligned_type *)this;
  local_38 = (domain_type *)a;
  if (pcVar1 == "N2cs8callableE") {
LAB_0026863e:
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    local_78.field_2._M_allocated_capacity = 0;
    local_58 = (object_method *)b;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::reserve
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)(local_90 + 0x18),
               (*(long *)(in_RCX + 0x30) - *(long *)(in_RCX + 0x20) >> 3) +
               (*(long *)(in_RCX + 0x40) - *(long *)(in_RCX + 0x48) >> 3) +
               ((((ulong)(*(long *)(in_RCX + 0x58) - *(long *)(in_RCX + 0x38)) >> 3) - 1) +
               (ulong)(*(long *)(in_RCX + 0x58) == 0)) * 0x40);
    ppsVar12 = *(slot_type ***)(in_RCX + 0x20);
    local_50 = *(flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 **)(in_RCX + 0x40);
    if ((flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)ppsVar12 != local_50) {
      local_90._16_8_ = *(long *)(in_RCX + 0x30);
      local_90._8_8_ = *(size_t *)(in_RCX + 0x38);
      do {
        local_98 = (undefined1  [8])*ppsVar12;
        pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_98);
        ptVar2 = *pptVar6;
        if (ptVar2 == (token_base *)0x0) {
LAB_0026877e:
          local_48 = (aligned_type *)*ppsVar12;
          parse_expr((runtime_type *)local_90,(iterator *)a,SUB81(&local_48,0));
          lvalue((var *)local_90);
          std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                    ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)(local_90 + 0x18),
                     (any *)local_98);
          cs_impl::any::recycle((any *)local_98);
          cs_impl::any::recycle((any *)local_90);
        }
        else {
          iVar4 = (*ptVar2->_vptr_token_base[2])(ptVar2);
          if (iVar4 != 6) goto LAB_0026877e;
          local_90._0_8_ = ptVar2[1]._vptr_token_base;
          parse_expr((runtime_type *)local_98,(iterator *)a,SUB81((runtime_type *)local_90,0));
          pdVar7 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                             ((any *)local_98);
          paVar13 = (pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                    .super__Deque_impl_data._M_start._M_cur;
          paVar3 = (pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                   super__Deque_impl_data._M_finish._M_cur;
          if (paVar13 != paVar3) {
            paVar9 = (pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                     _M_impl.super__Deque_impl_data._M_start._M_last;
            ppaVar11 = (pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                       _M_impl.super__Deque_impl_data._M_start._M_node;
            do {
              lvalue(paVar13);
              std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                        ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)(local_90 + 0x18),
                         (any *)local_90);
              cs_impl::any::recycle((any *)local_90);
              paVar13 = paVar13 + 1;
              if (paVar13 == paVar9) {
                paVar13 = ppaVar11[1];
                ppaVar11 = ppaVar11 + 1;
                paVar9 = paVar13 + 0x40;
              }
            } while (paVar13 != paVar3);
          }
          cs_impl::any::recycle((any *)local_98);
          a = (var *)local_38;
        }
        ppsVar12 = ppsVar12 + 1;
        if (ppsVar12 == (slot_type **)local_90._16_8_) {
          ppsVar12 = *(slot_type ***)(local_90._8_8_ + 8);
          local_90._8_8_ =
               &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_
                )->_M_string_length;
          local_90._16_8_ = ppsVar12 + 0x40;
        }
      } while ((flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ppsVar12 != local_50);
    }
    pcVar8 = cs_impl::any::const_val<cs::callable>(&local_58->object);
    paVar10 = local_40;
    if ((pcVar8->mFunc).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(pcVar8->mFunc)._M_invoker)
              ((_Any_data *)local_40,(vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)pcVar8);
  }
  else {
    if (*pcVar1 != '*') {
      iVar4 = strcmp(pcVar1,"N2cs8callableE");
      if (iVar4 == 0) goto LAB_0026863e;
    }
    if (b->_vptr_token_base == (_func_int **)0x0) {
      puVar5 = &void::typeinfo;
    }
    else {
      puVar5 = (undefined *)(**(code **)(*(long *)b->_vptr_token_base[2] + 0x10))();
    }
    pcVar1 = *(char **)(puVar5 + 8);
    if (pcVar1 != "N2cs13object_methodE") {
      if (*pcVar1 == '*') {
LAB_00268a7d:
        this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_90 + 0x18),"Unsupported operator operations(Fcall).","");
        runtime_error::runtime_error(this_00,(string *)(local_90 + 0x18));
        __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      iVar4 = strcmp(pcVar1,"N2cs13object_methodE");
      if (iVar4 != 0) goto LAB_00268a7d;
    }
    local_58 = cs_impl::any::const_val<cs::object_method>((any *)b);
    local_98 = (undefined1  [8])(local_58->object).mDat;
    if (local_98 != (undefined1  [8])0x0) {
      ((proxy *)local_98)->refcount = ((proxy *)local_98)->refcount + 1;
    }
    __l._M_len = 1;
    __l._M_array = (iterator)local_98;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)(local_90 + 0x18),__l,
               (allocator_type *)local_90);
    cs_impl::any::recycle((any *)local_98);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::reserve
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)(local_90 + 0x18),
               (*(long *)(in_RCX + 0x30) - *(long *)(in_RCX + 0x20) >> 3) +
               (*(long *)(in_RCX + 0x40) - *(long *)(in_RCX + 0x48) >> 3) +
               ((((ulong)(*(long *)(in_RCX + 0x58) - *(long *)(in_RCX + 0x38)) >> 3) - 1) +
               (ulong)(*(long *)(in_RCX + 0x58) == 0)) * 0x40);
    ppsVar12 = *(slot_type ***)(in_RCX + 0x20);
    local_50 = *(flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 **)(in_RCX + 0x40);
    if ((flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)ppsVar12 != local_50) {
      local_90._16_8_ = *(long *)(in_RCX + 0x30);
      local_90._8_8_ = *(size_t *)(in_RCX + 0x38);
      do {
        local_98 = (undefined1  [8])*ppsVar12;
        pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_98);
        ptVar2 = *pptVar6;
        if (ptVar2 == (token_base *)0x0) {
LAB_002689c0:
          local_48 = (aligned_type *)*ppsVar12;
          parse_expr((runtime_type *)local_90,(iterator *)a,SUB81(&local_48,0));
          lvalue((var *)local_90);
          std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                    ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)(local_90 + 0x18),
                     (any *)local_98);
          cs_impl::any::recycle((any *)local_98);
          cs_impl::any::recycle((any *)local_90);
        }
        else {
          iVar4 = (*ptVar2->_vptr_token_base[2])(ptVar2);
          if (iVar4 != 6) goto LAB_002689c0;
          local_90._0_8_ = ptVar2[1]._vptr_token_base;
          parse_expr((runtime_type *)local_98,(iterator *)a,SUB81((runtime_type *)local_90,0));
          pdVar7 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                             ((any *)local_98);
          paVar13 = (pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                    .super__Deque_impl_data._M_start._M_cur;
          paVar3 = (pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                   super__Deque_impl_data._M_finish._M_cur;
          if (paVar13 != paVar3) {
            paVar9 = (pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                     _M_impl.super__Deque_impl_data._M_start._M_last;
            ppaVar11 = (pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                       _M_impl.super__Deque_impl_data._M_start._M_node;
            do {
              lvalue(paVar13);
              std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                        ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)(local_90 + 0x18),
                         (any *)local_90);
              cs_impl::any::recycle((any *)local_90);
              paVar13 = paVar13 + 1;
              if (paVar13 == paVar9) {
                paVar13 = ppaVar11[1];
                ppaVar11 = ppaVar11 + 1;
                paVar9 = paVar13 + 0x40;
              }
            } while (paVar13 != paVar3);
          }
          cs_impl::any::recycle((any *)local_98);
          a = (var *)local_38;
        }
        ppsVar12 = ppsVar12 + 1;
        if (ppsVar12 == (slot_type **)local_90._16_8_) {
          ppsVar12 = *(slot_type ***)(local_90._8_8_ + 8);
          local_90._8_8_ =
               &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_
                )->_M_string_length;
          local_90._16_8_ = ppsVar12 + 0x40;
        }
      } while ((flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ppsVar12 != local_50);
    }
    pcVar8 = cs_impl::any::const_val<cs::callable>(&local_58->callable);
    paVar10 = local_40;
    if ((pcVar8->mFunc).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(pcVar8->mFunc)._M_invoker)
              ((_Any_data *)local_40,(vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)pcVar8);
  }
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
            ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)(local_90 + 0x18));
  return (var)(proxy *)paVar10;
}

Assistant:

var runtime_type::parse_fcall(const var &a, token_base *b)
	{
		if (a.type() == typeid(callable)) {
			vector args;
			token_base *ptr = nullptr;
			args.reserve(static_cast<token_arglist *>(b)->get_arglist().size());
			for (auto &tree: static_cast<token_arglist *>(b)->get_arglist()) {
				ptr = tree.root().data();
				if (ptr != nullptr && ptr->get_type() == token_types::expand) {
					var val = parse_expr(static_cast<token_expand *>(ptr)->get_tree().root());
					const auto &arr = val.const_val<array>();
					for (auto &it: arr)
						args.push_back(lvalue(it));
				}
				else
					args.push_back(lvalue(parse_expr(tree.root())));
			}
			return a.const_val<callable>().call(args);
		}
		else if (a.type() == typeid(object_method)) {
			const auto &om = a.const_val<object_method>();
			vector args{om.object};
			token_base *ptr = nullptr;
			args.reserve(static_cast<token_arglist *>(b)->get_arglist().size());
			for (auto &tree: static_cast<token_arglist *>(b)->get_arglist()) {
				ptr = tree.root().data();
				if (ptr != nullptr && ptr->get_type() == token_types::expand) {
					var val = parse_expr(static_cast<token_expand *>(ptr)->get_tree().root());
					const auto &arr = val.const_val<array>();
					for (auto &it: arr)
						args.push_back(lvalue(it));
				}
				else
					args.push_back(lvalue(parse_expr(tree.root())));
			}
			return om.callable.const_val<callable>().call(args);
		}
		else
			throw runtime_error("Unsupported operator operations(Fcall).");
	}